

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_monster_zombie::state_write(cse_alife_monster_zombie *this,xr_packet *packet)

{
  cse_alife_monster_abstract::state_write(&this->super_cse_alife_monster_abstract,packet);
  (*packet->_vptr_xr_packet[0xd])
            (*(undefined4 *)&(this->super_cse_alife_monster_abstract).field_0x214,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_eye_range,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_min_range,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_max_range,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_attack_speed,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_max_pursuit_radius,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_max_home_radius,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_hit_power,packet);
  (*packet->_vptr_xr_packet[8])(packet,(ulong)this->m_hit_interval);
  (*packet->_vptr_xr_packet[0xd])(this->m_attack_distance,packet);
  (*packet->_vptr_xr_packet[0xd])(this->m_attack_angle,packet);
  return;
}

Assistant:

void cse_alife_monster_zombie::state_write(xr_packet& packet)
{
	cse_alife_monster_abstract::state_write(packet);
	packet.w_float(m_eye_fov);
	packet.w_float(m_eye_range);
	packet.w_float(m_min_range);
	packet.w_float(m_max_range);
	packet.w_float(m_attack_speed);
	packet.w_float(m_max_pursuit_radius);
	packet.w_float(m_max_home_radius);
	packet.w_float(m_hit_power);
	packet.w_u16(m_hit_interval);
	packet.w_float(m_attack_distance);
	packet.w_float(m_attack_angle);
}